

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O3

void __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse
          (AffixTokenMatcherWarehouse *this)

{
  long lVar1;
  
  CodePointMatcherWarehouse::~CodePointMatcherWarehouse(&this->fCodePoints);
  (this->fCurrency).super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__CombinedCurrencyMatcher_003f3050;
  MaybeStackArray<char,_40>::~MaybeStackArray(&(this->fCurrency).fLocaleName.buffer);
  UnicodeString::~UnicodeString(&(this->fCurrency).beforeSuffixInsert);
  UnicodeString::~UnicodeString(&(this->fCurrency).afterPrefixInsert);
  lVar1 = 0x330;
  do {
    UnicodeString::~UnicodeString((UnicodeString *)((long)&this->fSetupData + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != 0x1b0);
  UnicodeString::~UnicodeString(&(this->fCurrency).fCurrency2);
  UnicodeString::~UnicodeString(&(this->fCurrency).fCurrency1);
  (this->fPermille).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003f1f18;
  UnicodeString::~UnicodeString(&(this->fPermille).super_SymbolMatcher.fString);
  (this->fPercent).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003f1f18;
  UnicodeString::~UnicodeString(&(this->fPercent).super_SymbolMatcher.fString);
  (this->fPlusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003f1f18;
  UnicodeString::~UnicodeString(&(this->fPlusSign).super_SymbolMatcher.fString);
  (this->fMinusSign).super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003f1f18;
  UnicodeString::~UnicodeString(&(this->fMinusSign).super_SymbolMatcher.fString);
  return;
}

Assistant:

class U_I18N_API AffixTokenMatcherWarehouse : public UMemory {
  public:
    AffixTokenMatcherWarehouse() = default;  // WARNING: Leaves the object in an unusable state

    AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData);

    NumberParseMatcher& minusSign();

    NumberParseMatcher& plusSign();

    NumberParseMatcher& percent();

    NumberParseMatcher& permille();

    NumberParseMatcher& currency(UErrorCode& status);

    IgnorablesMatcher& ignorables();

    NumberParseMatcher& nextCodePointMatcher(UChar32 cp);

  private:
    // NOTE: The following field may be unsafe to access after construction is done!
    const AffixTokenMatcherSetupData* fSetupData;

    // NOTE: These are default-constructed and should not be used until initialized.
    MinusSignMatcher fMinusSign;
    PlusSignMatcher fPlusSign;
    PercentMatcher fPercent;
    PermilleMatcher fPermille;
    CombinedCurrencyMatcher fCurrency;

    // Use a child class for code point matchers, since it requires non-default operators.
    CodePointMatcherWarehouse fCodePoints;

    friend class AffixPatternMatcherBuilder;
    friend class AffixPatternMatcher;
}